

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingGraph.cpp
# Opt level: O2

void __thiscall ProblemFireFightingGraph::SetYScopes(ProblemFireFightingGraph *this)

{
  ulong uVar1;
  ulong uVar2;
  uint i;
  Scope a;
  Scope x;
  Scope allAgents;
  allocator<char> local_d1;
  TwoStageDynamicBayesianNetwork *local_d0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  string local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar2 = 0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)&(this->super_ProblemFireFightingFactored).
                                   super_FactoredDecPOMDPDiscrete.
                                   super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                   super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar1 <= uVar2) break;
    Scope::Insert((Scope *)&local_88,(Index)uVar2);
    uVar2 = (ulong)((Index)uVar2 + 1);
  }
  local_d0 = &(this->super_ProblemFireFightingFactored).super_FactoredDecPOMDPDiscrete.
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn;
  for (i = 0; uVar2 = (ulong)i,
      uVar2 < *(ulong *)&(this->super_ProblemFireFightingFactored).super_FactoredDecPOMDPDiscrete.
                         field_0x710; i = i + 1) {
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (uVar2 != 0) {
      Scope::Insert((Scope *)&local_a8,i - 1);
      Scope::Insert((Scope *)&local_c8,i - 1);
    }
    Scope::Insert((Scope *)&local_a8,i);
    if (uVar2 < *(long *)&(this->super_ProblemFireFightingFactored).super_FactoredDecPOMDPDiscrete.
                          field_0x710 - 1U) {
      Scope::Insert((Scope *)&local_a8,i + 1);
      Scope::Insert((Scope *)&local_c8,i);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"<>",&local_d1);
    Scope::Scope((Scope *)&local_48,&local_68);
    TwoStageDynamicBayesianNetwork::SetSoI_Y
              (local_d0,i,(Scope *)&local_a8,(Scope *)&local_c8,(Scope *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void ProblemFireFightingGraph::SetYScopes()
{    
//specify connections for the 2DBN
#if DEBUG_PFFF
    cout << "About to set the SoIs for all next-stage(NS) SFs Y..."<<endl;
#endif
    Scope allAgents;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        allAgents.Insert(agI);

    for(Index yI=0; yI < _m_nrHouses; yI++)
    {
        //determine the X scope of influence (i.e., state factors at prev.stage)
        Scope x;
        Scope a;
        if(yI > 0)
        {
            x.Insert(yI-1);
            a.Insert(yI-1);
        }
        x.Insert(yI); // firelevel of house yI influenced by its PS firelevel
        if(yI < (_m_nrHouses-1) )
        {
            x.Insert(yI+1);
            a.Insert(yI);
        }

        SetSoI_Y( yI, //sfacI = 0 -> house 0
                  x,
                  a,
                  //allAgents,
                  Scope("<>") // no interdependencies between next-stage FLs
                );
    }
}